

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffirow(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long nshift_00;
  long lVar5;
  long nblock;
  LONGLONG freespace;
  LONGLONG nbytes;
  LONGLONG nshift;
  LONGLONG firstbyte;
  LONGLONG datasize;
  LONGLONG naxis2;
  LONGLONG naxis1;
  int *piStack_30;
  int tstatus;
  int *status_local;
  LONGLONG nrows_local;
  LONGLONG firstrow_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    piStack_30 = status;
    status_local = (int *)nrows;
    nrows_local = firstrow;
    firstrow_local = (LONGLONG)fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2)) {
        return *piStack_30;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*(int *)(*(long *)(firstrow_local + 8) + 0x58) == 0) {
      ffpmsg("Can only add rows to TABLE or BINTABLE extension (ffirow)");
      *piStack_30 = 0xeb;
      fptr_local._4_4_ = 0xeb;
    }
    else if ((long)status_local < 0) {
      *piStack_30 = 0x132;
      fptr_local._4_4_ = 0x132;
    }
    else if (status_local == (int *)0x0) {
      fptr_local._4_4_ = *piStack_30;
    }
    else {
      lVar5 = *(long *)(*(long *)(firstrow_local + 8) + 0x3c8);
      lVar1 = *(long *)(*(long *)(firstrow_local + 8) + 0x3c0);
      if (lVar1 < nrows_local) {
        ffpmsg("Insert position greater than the number of rows in the table (ffirow)");
        *piStack_30 = 0x133;
        fptr_local._4_4_ = 0x133;
      }
      else if (nrows_local < 0) {
        ffpmsg("Insert position is less than 0 (ffirow)");
        *piStack_30 = 0x133;
        fptr_local._4_4_ = 0x133;
      }
      else {
        lVar3 = *(long *)(*(long *)(firstrow_local + 8) + 0x3d8) +
                *(long *)(*(long *)(firstrow_local + 8) + 0x3e0);
        lVar4 = ((lVar3 + 0xb3f) / 0xb40) * 0xb40 - lVar3;
        nshift_00 = lVar5 * (long)status_local;
        if (lVar4 - nshift_00 < 0) {
          ffiblk((fitsfile *)firstrow_local,((nshift_00 - lVar4) + 0xb3f) / 0xb40,1,piStack_30);
        }
        lVar5 = lVar5 * nrows_local;
        if (0 < nshift_00) {
          ffshft((fitsfile *)firstrow_local,*(long *)(*(long *)(firstrow_local + 8) + 0x88) + lVar5,
                 lVar3 - lVar5,nshift_00,piStack_30);
        }
        *(long *)(*(long *)(firstrow_local + 8) + 0x3d8) =
             nshift_00 + *(long *)(*(long *)(firstrow_local + 8) + 0x3d8);
        naxis1._4_4_ = 0;
        ffmkyj((fitsfile *)firstrow_local,"THEAP",
               *(LONGLONG *)(*(long *)(firstrow_local + 8) + 0x3d8),"&",(int *)((long)&naxis1 + 4));
        ffmkyj((fitsfile *)firstrow_local,"NAXIS2",lVar1 + (long)status_local,"&",piStack_30);
        *(long *)(*(long *)(firstrow_local + 8) + 0x3c0) =
             (long)status_local + *(long *)(*(long *)(firstrow_local + 8) + 0x3c0);
        *(long *)(*(long *)(firstrow_local + 8) + 0x3b8) =
             (long)status_local + *(long *)(*(long *)(firstrow_local + 8) + 0x3b8);
        fptr_local._4_4_ = *piStack_30;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffirow(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstrow,   /* I - insert space AFTER this row              */
                            /*     0 = insert space at beginning of table   */
           LONGLONG nrows,      /* I - number of rows to insert                 */
           int *status)     /* IO - error status                            */
/*
 insert NROWS blank rows immediated after row firstrow (1 = first row).
 Set firstrow = 0 to insert space at the beginning of the table.
*/
{
    int tstatus;
    LONGLONG naxis1, naxis2;
    LONGLONG datasize, firstbyte, nshift, nbytes;
    LONGLONG freespace;
    long nblock;

    if (*status > 0)
        return(*status);

        /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
         /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only add rows to TABLE or BINTABLE extension (ffirow)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    /* get the current size of the table */
    /* use internal structure since NAXIS2 keyword may not be up to date */
    naxis1 = (fptr->Fptr)->rowlength;
    naxis2 = (fptr->Fptr)->numrows;

    if (firstrow > naxis2)
    {
        ffpmsg(
   "Insert position greater than the number of rows in the table (ffirow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow < 0)
    {
        ffpmsg("Insert position is less than 0 (ffirow)");
        return(*status = BAD_ROW_NUM);
    }

    /* current data size */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nshift = naxis1 * nrows;          /* no. of bytes to add to table */

    if ( (freespace - nshift) < 0)   /* not enough existing space? */
    {
        nblock = (long) ((nshift - freespace + 2879) / 2880);   /* number of blocks */
        ffiblk(fptr, nblock, 1, status);               /* insert the blocks */
    }

    firstbyte = naxis1 * firstrow;    /* relative insert position */
    nbytes = datasize - firstbyte;           /* no. of bytes to shift down */
    firstbyte += ((fptr->Fptr)->datastart);  /* absolute insert position */

    if (nshift > 0) {  /* nshift may be zero if naxis1 == naxis2 == 0 */
      ffshft(fptr, firstbyte, nbytes, nshift, status); /* shift rows and heap */
    }

    /* update the heap starting address */
    (fptr->Fptr)->heapstart += nshift;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

    /* update the NAXIS2 keyword */
    ffmkyj(fptr, "NAXIS2", naxis2 + nrows, "&", status);
    ((fptr->Fptr)->numrows) += nrows;
    ((fptr->Fptr)->origrows) += nrows;

    return(*status);
}